

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

void test_fs_partial(int doread)

{
  int iVar1;
  uv_buf_t *bufs;
  void *__s1;
  size_t sVar2;
  uv_loop_t *puVar3;
  uv_buf_t uVar4;
  int result_2;
  int result_1;
  size_t read_iovcount;
  int result;
  int nread;
  uv_buf_t *read_iovs;
  size_t local_108;
  ulong local_100;
  size_t index;
  char *buffer;
  uv_buf_t *iovs;
  size_t iovcount;
  int pipe_fds [2];
  uv_signal_t signal;
  uv_thread_t thread;
  thread_ctx_conflict ctx;
  int doread_local;
  
  iovs = (uv_buf_t *)0xd431;
  ctx._36_4_ = doread;
  bufs = (uv_buf_t *)malloc(0xd4310);
  if (bufs == (uv_buf_t *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xd88,"iovs != NULL");
    abort();
  }
  thread = pthread_self();
  ctx.size = ctx._36_4_;
  ctx.data._4_4_ = 1000;
  ctx.data._0_4_ = 0xac67d;
  ctx._8_8_ = malloc(0xac67d);
  if ((void *)ctx._8_8_ == (void *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xd8f,"ctx.data != NULL");
    abort();
  }
  __s1 = malloc((long)(int)ctx.data);
  if (__s1 == (void *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xd91,"buffer != NULL");
    abort();
  }
  for (local_100 = 0; local_100 < 0xd431; local_100 = local_100 + 1) {
    uVar4 = uv_buf_init((char *)((long)__s1 + local_100 * 0xd),0xd);
    read_iovs = (uv_buf_t *)uVar4.base;
    bufs[local_100].base = (char *)read_iovs;
    local_108 = uVar4.len;
    bufs[local_100].len = local_108;
  }
  loop = uv_default_loop();
  iVar1 = uv_signal_init(loop,(uv_signal_t *)pipe_fds);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xd98,"0 == uv_signal_init(loop, &signal)");
    abort();
  }
  iVar1 = uv_signal_start((uv_signal_t *)pipe_fds,sig_func,10);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xd99,"0 == uv_signal_start(&signal, sig_func, SIGUSR1)");
    abort();
  }
  iVar1 = pipe((int *)&iovcount);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xd9b,"0 == pipe(pipe_fds)");
    abort();
  }
  ctx.pid._0_4_ = pipe_fds[(long)(int)ctx._36_4_ + -2];
  iVar1 = uv_thread_create((uv_thread_t *)&signal.caught_signals,thread_main,&thread);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xd9e,"0 == uv_thread_create(&thread, thread_main, &ctx)");
    abort();
  }
  if (ctx._36_4_ == 0) {
    iVar1 = uv_fs_write(loop,&write_req,iovcount._4_4_,bufs,0xd431,-1,(uv_fs_cb)0x0);
    if (write_req.result != iVar1) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
              ,0xdb6,"write_req.result == result");
      abort();
    }
    if (iVar1 != (int)ctx.data) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
              ,0xdb7,"result == ctx.size");
      abort();
    }
    uv_fs_req_cleanup(&write_req);
  }
  else {
    read_iovcount._4_4_ = 0;
    _result = bufs;
    while (read_iovcount._4_4_ < (int)ctx.data) {
      iVar1 = uv_fs_read(loop,&read_req,(uv_file)iovcount,_result,(uint)iovs,-1,(uv_fs_cb)0x0);
      if (iVar1 < 1) {
        if (iVar1 != -4) {
          fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
                  ,0xdaf,"result == UV_EINTR");
          abort();
        }
      }
      else {
        sVar2 = uv_test_fs_buf_offset(_result,(long)iVar1);
        _result = _result + sVar2;
        iovs = (uv_buf_t *)((long)iovs - sVar2);
        read_iovcount._4_4_ = iVar1 + read_iovcount._4_4_;
      }
      uv_fs_req_cleanup(&read_req);
    }
  }
  iVar1 = memcmp(__s1,(void *)ctx._8_8_,(long)(int)ctx.data);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xdbb,"0 == memcmp(buffer, ctx.data, ctx.size)");
    abort();
  }
  iVar1 = uv_thread_join((uv_thread_t *)&signal.caught_signals);
  if (iVar1 == 0) {
    iVar1 = uv_run(loop,UV_RUN_DEFAULT);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
              ,0xdbe,"0 == uv_run(loop, UV_RUN_DEFAULT)");
      abort();
    }
    iVar1 = close(iovcount._4_4_);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
              ,0xdc0,"0 == close(pipe_fds[1])");
      abort();
    }
    uv_close((uv_handle_t *)pipe_fds,(uv_close_cb)0x0);
    iVar1 = uv_fs_read(loop,&read_req,(uv_file)iovcount,bufs,1,-1,(uv_fs_cb)0x0);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
              ,0xdc6,"result == 0");
      abort();
    }
    uv_fs_req_cleanup(&read_req);
    iVar1 = close((uv_file)iovcount);
    if (iVar1 == 0) {
      free(bufs);
      free(__s1);
      free((void *)ctx._8_8_);
      puVar3 = uv_default_loop();
      close_loop(puVar3);
      puVar3 = uv_default_loop();
      iVar1 = uv_loop_close(puVar3);
      if (iVar1 == 0) {
        return;
      }
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
              ,0xdcf,"0 == uv_loop_close(uv_default_loop())");
      abort();
    }
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xdc9,"0 == close(pipe_fds[0])");
    abort();
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,0xdbd,"0 == uv_thread_join(&thread)");
  abort();
}

Assistant:

static void test_fs_partial(int doread) {
  struct thread_ctx ctx;
  uv_thread_t thread;
  uv_signal_t signal;
  int pipe_fds[2];
  size_t iovcount;
  uv_buf_t* iovs;
  char* buffer;
  size_t index;

  iovcount = 54321;

  iovs = malloc(sizeof(*iovs) * iovcount);
  ASSERT(iovs != NULL);

  ctx.pid = pthread_self();
  ctx.doread = doread;
  ctx.interval = 1000;
  ctx.size = sizeof(test_buf) * iovcount;
  ctx.data = malloc(ctx.size);
  ASSERT(ctx.data != NULL);
  buffer = malloc(ctx.size);
  ASSERT(buffer != NULL);

  for (index = 0; index < iovcount; ++index)
    iovs[index] = uv_buf_init(buffer + index * sizeof(test_buf), sizeof(test_buf));

  loop = uv_default_loop();

  ASSERT(0 == uv_signal_init(loop, &signal));
  ASSERT(0 == uv_signal_start(&signal, sig_func, SIGUSR1));

  ASSERT(0 == pipe(pipe_fds));

  ctx.fd = pipe_fds[doread];
  ASSERT(0 == uv_thread_create(&thread, thread_main, &ctx));

  if (doread) {
    uv_buf_t* read_iovs;
    int nread;
    read_iovs = iovs;
    nread = 0;
    while (nread < ctx.size) {
      int result;
      result = uv_fs_read(loop, &read_req, pipe_fds[0], read_iovs, iovcount, -1, NULL);
      if (result > 0) {
        size_t read_iovcount;
        read_iovcount = uv_test_fs_buf_offset(read_iovs, result);
        read_iovs += read_iovcount;
        iovcount -= read_iovcount;
        nread += result;
      } else {
        ASSERT(result == UV_EINTR);
      }
      uv_fs_req_cleanup(&read_req);
    }
  } else {
    int result;
    result = uv_fs_write(loop, &write_req, pipe_fds[1], iovs, iovcount, -1, NULL);
    ASSERT(write_req.result == result);
    ASSERT(result == ctx.size);
    uv_fs_req_cleanup(&write_req);
  }

  ASSERT(0 == memcmp(buffer, ctx.data, ctx.size));

  ASSERT(0 == uv_thread_join(&thread));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));

  ASSERT(0 == close(pipe_fds[1]));
  uv_close((uv_handle_t*) &signal, NULL);

  { /* Make sure we read everything that we wrote. */
      int result;
      result = uv_fs_read(loop, &read_req, pipe_fds[0], iovs, 1, -1, NULL);
      ASSERT(result == 0);
      uv_fs_req_cleanup(&read_req);
  }
  ASSERT(0 == close(pipe_fds[0]));

  free(iovs);
  free(buffer);
  free(ctx.data);

  MAKE_VALGRIND_HAPPY();
}